

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

uint __thiscall dynamicgraph::command::Value::unsignedValue(Value *this)

{
  ExceptionAbstract *this_00;
  int local_44;
  string local_40;
  
  if (this->type_ == UNSIGNED) {
    return *this->value_;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_44 = 700;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"value is not an unsigned int","");
  ExceptionAbstract::ExceptionAbstract(this_00,&local_44,&local_40);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

unsigned Value::unsignedValue() const {
  if (type_ == UNSIGNED) return *((const unsigned *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS,
                          "value is not an unsigned int");
}